

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::base::StringSplitter::Initialize(StringSplitter *this,char *str,size_t size)

{
  this->next_ = str;
  this->end_ = str + size;
  this->cur_ = (char *)0x0;
  this->cur_size_ = 0;
  if (size != 0) {
    (str + size)[-1] = '\0';
  }
  return;
}

Assistant:

void StringSplitter::Initialize(char* str, size_t size) {
  PERFETTO_DCHECK(!size || str);
  next_ = str;
  end_ = str + size;
  cur_ = nullptr;
  cur_size_ = 0;
  if (size)
    next_[size - 1] = '\0';
}